

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  int *piVar1;
  double __x;
  int iVar2;
  double __y;
  int *piVar3;
  float *Xc_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  ulong *puVar13;
  size_t *key;
  ulong *key_00;
  double dVar14;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar15;
  tuple<> local_c1;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int *local_88;
  float *local_80;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_78;
  double local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  size_t *local_50;
  size_t local_48;
  size_t *local_40;
  size_t local_38;
  
  local_c0 = (double)(long)Xc_indptr[col_num];
  local_b8 = (double)(long)Xc_indptr[col_num + 1];
  if (end < st || Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    return -INFINITY;
  }
  key = ix_arr + st;
  local_b0 = 0.0;
  local_88 = Xc_ind;
  local_80 = Xc;
  local_58 = st;
  local_50 = ix_arr;
  local_38 = col_num;
  do {
    local_78._M_head_impl = key;
    pVar15 = tsl::detail_robin_hash::
             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
             ::
             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                       ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                        (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
    piVar3 = local_88;
    dVar14 = local_b8;
    local_b0 = local_b0 + *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
    st = st + 1;
    key = key + 1;
  } while (st <= end);
  if (local_b0 <= 0.0) {
    return -INFINITY;
  }
  local_60 = (long)local_b8 + -1;
  key_00 = local_50 + local_58;
  puVar13 = local_50 + end + 1;
  uVar5 = (long)puVar13 - (long)key_00 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar9 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key_00[uVar6] < (ulong)(long)local_88[(long)local_c0]) {
        key_00 = key_00 + uVar6 + 1;
        uVar5 = uVar9;
      }
    } while (0 < (long)uVar5);
  }
  uVar5 = (ulong)local_88[(long)local_b8 + -1];
  local_40 = local_50 + end;
  piVar12 = local_88;
  local_68 = uVar5;
  local_48 = end;
  if (missing_action == Fail) {
    if (local_b8 == local_c0 || key_00 == puVar13) {
      return -INFINITY;
    }
    local_b8 = 0.0;
    local_90 = 0.0;
    local_98 = 0.0;
    dVar8 = local_c0;
    local_c0 = 0.0;
    while (uVar6 = *key_00, uVar6 <= uVar5) {
      piVar1 = piVar12 + (long)dVar8;
      iVar2 = *piVar1;
      if (iVar2 == (int)uVar6) {
        local_78._M_head_impl = key_00;
        pVar15 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
        local_a0 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
        local_70 = (double)local_80[(long)dVar8];
        local_a8 = local_70 * local_70;
        local_c0 = fma(local_a0,local_70,local_c0);
        local_b8 = fma(local_a0,local_a8,local_b8);
        local_90 = fma(local_a0,local_70 * local_a8,local_90);
        local_98 = fma(local_a0,local_a8 * local_a8,local_98);
        piVar12 = local_88;
        if ((key_00 == local_40) || (dVar8 == (double)local_60)) break;
        piVar7 = piVar1 + 1;
        key_00 = key_00 + 1;
        uVar6 = (long)piVar3 + ((long)dVar14 * 4 - (long)piVar7) >> 2;
        uVar5 = local_68;
        if (0 < (long)uVar6) {
          do {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if ((ulong)(long)piVar7[uVar9] < *key_00) {
              piVar7 = piVar7 + uVar9 + 1;
              uVar6 = uVar10;
            }
          } while (0 < (long)uVar6);
        }
LAB_00135a7b:
        dVar8 = (double)((long)piVar7 - (long)piVar12 >> 2);
      }
      else {
        if (iVar2 <= (int)uVar6) {
          piVar7 = piVar1 + 1;
          uVar9 = (long)piVar3 + ((long)dVar14 * 4 - (long)(piVar1 + 1)) >> 2;
          while (0 < (long)uVar9) {
            uVar10 = uVar9 >> 1;
            uVar11 = ~uVar10 + uVar9;
            uVar9 = uVar10;
            if ((ulong)(long)piVar7[uVar10] < uVar6) {
              piVar7 = piVar7 + uVar10 + 1;
              uVar9 = uVar11;
            }
          }
          goto LAB_00135a7b;
        }
        key_00 = key_00 + 1;
        uVar6 = (long)puVar13 - (long)key_00 >> 3;
        while (0 < (long)uVar6) {
          uVar9 = uVar6 >> 1;
          uVar10 = ~uVar9 + uVar6;
          uVar6 = uVar9;
          if (key_00[uVar9] < (ulong)(long)iVar2) {
            key_00 = key_00 + uVar9 + 1;
            uVar6 = uVar10;
          }
        }
      }
      if ((key_00 == puVar13) || (dVar8 == dVar14)) break;
    }
  }
  else {
    if (local_b8 != local_c0 && key_00 != puVar13) {
      local_b8 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      dVar8 = local_c0;
      local_c0 = 0.0;
      while (uVar6 = *key_00, uVar6 <= uVar5) {
        piVar1 = piVar12 + (long)dVar8;
        iVar2 = *piVar1;
        if (iVar2 == (int)uVar6) {
          local_78._M_head_impl = key_00;
          pVar15 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
          __x = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
          __y = (double)local_80[(long)dVar8];
          if ((NAN(local_80[(long)dVar8])) || (ABS(__y) == INFINITY)) {
            local_b0 = local_b0 - __x;
          }
          else {
            local_a8 = __y * __y;
            local_a0 = __x;
            local_70 = __y;
            local_c0 = fma(__x,__y,local_c0);
            local_b8 = fma(local_a0,local_a8,local_b8);
            local_90 = fma(local_a0,local_70 * local_a8,local_90);
            local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          }
          piVar12 = local_88;
          if ((key_00 == local_40) || (dVar8 == (double)local_60)) break;
          piVar7 = piVar1 + 1;
          key_00 = key_00 + 1;
          uVar6 = (long)piVar3 + ((long)dVar14 * 4 - (long)piVar7) >> 2;
          uVar5 = local_68;
          if (0 < (long)uVar6) {
            do {
              uVar9 = uVar6 >> 1;
              uVar10 = ~uVar9 + uVar6;
              uVar6 = uVar9;
              if ((ulong)(long)piVar7[uVar9] < *key_00) {
                piVar7 = piVar7 + uVar9 + 1;
                uVar6 = uVar10;
              }
            } while (0 < (long)uVar6);
          }
LAB_0013581e:
          dVar8 = (double)((long)piVar7 - (long)piVar12 >> 2);
        }
        else {
          if (iVar2 <= (int)uVar6) {
            piVar7 = piVar1 + 1;
            uVar9 = (long)piVar3 + ((long)dVar14 * 4 - (long)(piVar1 + 1)) >> 2;
            while (0 < (long)uVar9) {
              uVar10 = uVar9 >> 1;
              uVar11 = ~uVar10 + uVar9;
              uVar9 = uVar10;
              if ((ulong)(long)piVar7[uVar10] < uVar6) {
                piVar7 = piVar7 + uVar10 + 1;
                uVar9 = uVar11;
              }
            }
            goto LAB_0013581e;
          }
          key_00 = key_00 + 1;
          uVar6 = (long)puVar13 - (long)key_00 >> 3;
          while (0 < (long)uVar6) {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if (key_00[uVar9] < (ulong)(long)iVar2) {
              key_00 = key_00 + uVar9 + 1;
              uVar6 = uVar10;
            }
          }
        }
        if ((key_00 == puVar13) || (dVar8 == dVar14)) break;
      }
    }
    else {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b8 = 0.0;
      local_c0 = 0.0;
    }
    if (local_b0 <= 0.0) {
      return -INFINITY;
    }
  }
  Xc_00 = local_80;
  if ((1.0 < local_b0) && ((local_b8 != 0.0 || (NAN(local_b8))))) {
    if ((local_b8 != local_c0 * local_c0) || (NAN(local_b8) || NAN(local_c0 * local_c0))) {
      local_80 = (float *)(local_c0 / local_b0);
      local_a0 = (double)local_80 * (double)local_80;
      local_a8 = local_b8 / local_b0 - local_a0;
      if ((!NAN(local_a8)) &&
         ((2.220446049250313e-16 < local_a8 ||
          (bVar4 = check_more_than_two_unique_values<float,int>
                             (local_50,local_58,local_48,local_38,Xc_indptr,piVar12,Xc_00,
                              missing_action), bVar4)))) {
        if (local_a8 <= 0.0) {
          return 0.0;
        }
        dVar14 = (local_a0 * (double)local_80 * (double)local_80 * local_b0 +
                 local_c0 * -4.0 * local_a0 * (double)local_80 +
                 local_b8 * 6.0 * local_a0 + local_90 * -4.0 * (double)local_80 + local_98) /
                 (local_a8 * local_a8 * local_b0);
        if ((long)ABS(dVar14) < 0x7ff0000000000000) {
          if (dVar14 <= 0.0) {
            return 0.0;
          }
          return dVar14;
        }
        return -INFINITY;
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}